

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

ValueType *
HighsHashTree<std::pair<int,_int>,_double>::find_recurse
          (NodePtr node,uint64_t hash,int hashPos,pair<int,_int> *key)

{
  pair<int,_int> pVar1;
  ulong uVar2;
  ValueType *pVVar3;
  long *plVar4;
  uint uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  
  do {
code_r0x003280a0:
    switch((uint)node.ptrAndType & 7) {
    case 0:
      return (ValueType *)0x0;
    case 1:
      plVar4 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
      pVar1 = *key;
      do {
        auVar6._0_4_ = -(uint)((int)plVar4[1] == pVar1.first);
        iVar7 = -(uint)((int)((ulong)plVar4[1] >> 0x20) == pVar1.second);
        auVar6._4_4_ = auVar6._0_4_;
        auVar6._8_4_ = iVar7;
        auVar6._12_4_ = iVar7;
        uVar5 = movmskpd((int)key,auVar6);
        key = (pair<int,_int> *)(ulong)uVar5;
        if (uVar5 == 3) {
          return (ValueType *)(plVar4 + 2);
        }
        plVar4 = (long *)*plVar4;
      } while (plVar4 != (long *)0x0);
      return (ValueType *)0x0;
    case 2:
      pVVar3 = InnerLeaf<1>::find_entry
                         ((InnerLeaf<1> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar3;
    case 3:
      pVVar3 = InnerLeaf<2>::find_entry
                         ((InnerLeaf<2> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar3;
    case 4:
      pVVar3 = InnerLeaf<3>::find_entry
                         ((InnerLeaf<3> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar3;
    case 5:
      pVVar3 = InnerLeaf<4>::find_entry
                         ((InnerLeaf<4> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar3;
    case 6:
      uVar5 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
      uVar2 = *(ulong *)(node.ptrAndType & 0xfffffffffffffff8);
      if ((uVar2 >> uVar5 & 1) == 0) {
        return (ValueType *)0x0;
      }
      node.ptrAndType =
           ((ulong *)(node.ptrAndType & 0xfffffffffffffff8))[POPCOUNT(uVar2 >> (sbyte)uVar5)];
      hashPos = hashPos + 1;
      break;
    default:
      goto code_r0x003280a0;
    }
  } while( true );
}

Assistant:

static const ValueType* find_recurse(NodePtr node, uint64_t hash, int hashPos,
                                       const K& key) {
    int startPos = hashPos;
    switch (node.getType()) {
      case kEmpty:
        return nullptr;
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();
        ListNode* iter = &leaf->first;
        do {
          if (iter->entry.key() == key) return &iter->entry.value();
          iter = iter->next;
        } while (iter != nullptr);
        return nullptr;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = node.getInnerLeafSizeClass1();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = node.getInnerLeafSizeClass2();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = node.getInnerLeafSizeClass3();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = node.getInnerLeafSizeClass4();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        if (!branch->occupation.test(get_hash_chunk(hash, hashPos)))
          return nullptr;
        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
        node = branch->child[location];
        ++hashPos;
      }
    }

    assert(hashPos > startPos);

    return find_recurse(node, hash, hashPos, key);
  }